

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void gflags::SetArgv(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  const_iterator c;
  allocator local_41;
  value_type local_40;
  int local_1c;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  if (!SetArgv::called_set_argv) {
    SetArgv::called_set_argv = true;
    ppcStack_18 = argv;
    argv_local._4_4_ = argc;
    if (argc < 1) {
      __assert_fail("argc > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                    ,0x5f2,"void gflags::SetArgv(int, const char **)");
    }
    std::__cxx11::string::operator=((string *)argv0_abi_cxx11_,*argv);
    std::__cxx11::string::clear();
    for (local_1c = 0; local_1c < argv_local._4_4_; local_1c = local_1c + 1) {
      if (local_1c != 0) {
        std::__cxx11::string::operator+=((string *)cmdline_abi_cxx11_," ");
      }
      std::__cxx11::string::operator+=((string *)cmdline_abi_cxx11_,ppcStack_18[local_1c]);
      pcVar1 = ppcStack_18[local_1c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)argvs_abi_cxx11_,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    argv_sum = 0;
    local_68._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_60,&local_68);
    while( true ) {
      local_70._M_current = (char *)std::__cxx11::string::end();
      bVar2 = __gnu_cxx::operator!=(&local_60,&local_70);
      if (!bVar2) break;
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_60);
      argv_sum = *pcVar3 + argv_sum;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_60);
    }
  }
  return;
}

Assistant:

void SetArgv(int argc, const char** argv) {
  static bool called_set_argv = false;
  if (called_set_argv) return;
  called_set_argv = true;

  assert(argc > 0); // every program has at least a name
  argv0 = argv[0];

  cmdline.clear();
  for (int i = 0; i < argc; i++) {
    if (i != 0) cmdline += " ";
    cmdline += argv[i];
    argvs.push_back(argv[i]);
  }

  // Compute a simple sum of all the chars in argv
  argv_sum = 0;
  for (string::const_iterator c = cmdline.begin(); c != cmdline.end(); ++c) {
    argv_sum += *c;
  }
}